

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtGroup::init
          (CreateContextExtGroup *this,EVP_PKEY_CTX *ctx)

{
  EGLenum EVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RAX;
  FilterList *pFVar5;
  TestCase *this_00;
  size_t sVar6;
  undefined8 extraout_RAX;
  InternalError *this_01;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  code *filter_00;
  EGLint *attribList;
  allocator<char> local_71;
  TestContext **local_70;
  FilterList filter;
  string local_50;
  
  lVar9 = 0;
  do {
    if (lVar9 == 0x14) {
      return (int)in_RAX;
    }
    filter.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filter.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filter.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pFVar5 = eglu::FilterList::operator<<
                       (&filter,(ConfigFilter)(&PTR_colorBits<5,6,5,0>_01e0a680)[lVar9 * 5]);
    pFVar5 = eglu::FilterList::operator<<(pFVar5,(ConfigFilter)(&PTR_noDepth_01e0a688)[lVar9 * 5]);
    pFVar5 = eglu::FilterList::operator<<(pFVar5,(ConfigFilter)(&PTR_noStencil_01e0a690)[lVar9 * 5])
    ;
    iVar10 = this->m_apiBit;
    filter_00 = egl::(anonymous_namespace)::renderable<4u>;
    if (iVar10 != 4) {
      if (iVar10 == 8) {
        filter_00 = egl::(anonymous_namespace)::renderable<8u>;
      }
      else if (iVar10 == 0x40) {
        filter_00 = egl::(anonymous_namespace)::renderable<64u>;
      }
      else {
        filter_00 = egl::(anonymous_namespace)::renderable<0u>;
      }
    }
    eglu::FilterList::operator<<(pFVar5,filter_00);
    this_00 = (TestCase *)operator_new(0xe0);
    EVar1 = this->m_api;
    attribList = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    egl::TestCase::TestCase
              (this_00,(this->super_TestCaseGroup).m_eglTestCtx,
               (&PTR_anon_var_dwarf_f09785_01e0a670)[lVar9 * 5],
               (&PTR_anon_var_dwarf_f0979c_01e0a678)[lVar9 * 5]);
    (this_00->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__CreateContextExtCase_01e0a9a0;
    *(undefined1 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
    *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
    local_70 = &this_00[1].super_TestCase.super_TestNode.m_testCtx;
    std::
    vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ::vector((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
              *)local_70,&filter.m_rules);
    sVar6 = getAttribListLength(attribList);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)
               this_00[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf,attribList,
               attribList + sVar6,(allocator_type *)&local_50);
    *(EGLenum *)&this_00[1].super_TestCase.super_TestNode.m_description._M_string_length = EVar1;
    uVar8 = (uint)(EVar1 != 0x30a0);
    this_00[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&this_00[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
    *(undefined8 *)&this_00[1].super_TestCase.super_TestNode.m_nodeType = 0;
    this_00[1].super_TestCase.super_TestNode.m_children.
    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    iVar10 = 0;
    uVar7 = 1;
    uVar4 = 0;
LAB_00dd4def:
    do {
      for (; iVar2 = *attribList, iVar2 == 0x3098; attribList = attribList + 2) {
        uVar7 = attribList[1];
LAB_00dd4e6d:
      }
      if (iVar2 == 0x30bf) goto LAB_00dd4e6d;
      if (iVar2 == 0x30fb) {
        iVar10 = attribList[1];
        goto LAB_00dd4e6d;
      }
      if (iVar2 == 0x30fc) {
        uVar4 = uVar4 | ((uint)attribList[1] >> 2 & 1) + (attribList[1] & 3U) * 2;
        goto LAB_00dd4e6d;
      }
      if (iVar2 == 0x30fd) {
        uVar3 = attribList[1];
        if ((uVar3 != 1) && (uVar8 = uVar3, uVar3 != 2)) {
          this_01 = (InternalError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Indeterminate OpenGL profile",&local_71);
          tcu::InternalError::InternalError(this_01,&local_50);
          __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        attribList = attribList + 2;
        goto LAB_00dd4def;
      }
      if ((iVar2 == 0x3138) || (iVar2 == 0x31bd)) goto LAB_00dd4e6d;
    } while (iVar2 != 0x3038);
    *(uint *)&this_00[1].super_TestCase.super_TestNode.m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish = uVar8 << 8 | uVar7 | uVar4 << 10 | iVar10 << 4;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::
    _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ::~_Vector_base((_Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                     *)&filter);
    lVar9 = lVar9 + 1;
    in_RAX = extraout_RAX;
  } while( true );
}

Assistant:

void CreateContextExtGroup::init (void)
{
	const struct
	{
		const char*				name;
		const char*				description;

		eglu::ConfigFilter		colorFilter;
		eglu::ConfigFilter		depthFilter;
		eglu::ConfigFilter		stencilFilter;
	} groups[] =
	{
		{ "rgb565_no_depth_no_stencil",		"RGB565 configs without depth or stencil",		colorBits<5, 6, 5, 0>, noDepth,		noStencil	},
		{ "rgb565_no_depth_stencil",		"RGB565 configs with stencil and no depth",		colorBits<5, 6, 5, 0>, noDepth,		hasStencil	},
		{ "rgb565_depth_no_stencil",		"RGB565 configs with depth and no stencil",		colorBits<5, 6, 5, 0>, hasDepth,	noStencil	},
		{ "rgb565_depth_stencil",			"RGB565 configs with depth and stencil",		colorBits<5, 6, 5, 0>, hasDepth,	hasStencil	},

		{ "rgb888_no_depth_no_stencil",		"RGB888 configs without depth or stencil",		colorBits<8, 8, 8, 0>, noDepth,		noStencil	},
		{ "rgb888_no_depth_stencil",		"RGB888 configs with stencil and no depth",		colorBits<8, 8, 8, 0>, noDepth,		hasStencil	},
		{ "rgb888_depth_no_stencil",		"RGB888 configs with depth and no stencil",		colorBits<8, 8, 8, 0>, hasDepth,	noStencil	},
		{ "rgb888_depth_stencil",			"RGB888 configs with depth and stencil",		colorBits<8, 8, 8, 0>, hasDepth,	hasStencil	},

		{ "rgba4444_no_depth_no_stencil",	"RGBA4444 configs without depth or stencil",	colorBits<4, 4, 4, 4>, noDepth,		noStencil	},
		{ "rgba4444_no_depth_stencil",		"RGBA4444 configs with stencil and no depth",	colorBits<4, 4, 4, 4>, noDepth,		hasStencil	},
		{ "rgba4444_depth_no_stencil",		"RGBA4444 configs with depth and no stencil",	colorBits<4, 4, 4, 4>, hasDepth,	noStencil	},
		{ "rgba4444_depth_stencil",			"RGBA4444 configs with depth and stencil",		colorBits<4, 4, 4, 4>, hasDepth,	hasStencil	},

		{ "rgba5551_no_depth_no_stencil",	"RGBA5551 configs without depth or stencil",	colorBits<5, 5, 5, 1>, noDepth,		noStencil	},
		{ "rgba5551_no_depth_stencil",		"RGBA5551 configs with stencil and no depth",	colorBits<5, 5, 5, 1>, noDepth,		hasStencil	},
		{ "rgba5551_depth_no_stencil",		"RGBA5551 configs with depth and no stencil",	colorBits<5, 5, 5, 1>, hasDepth,	noStencil	},
		{ "rgba5551_depth_stencil",			"RGBA5551 configs with depth and stencil",		colorBits<5, 5, 5, 1>, hasDepth,	hasStencil	},

		{ "rgba8888_no_depth_no_stencil",	"RGBA8888 configs without depth or stencil",	colorBits<8, 8, 8, 8>, noDepth,		noStencil	},
		{ "rgba8888_no_depth_stencil",		"RGBA8888 configs with stencil and no depth",	colorBits<8, 8, 8, 8>, noDepth,		hasStencil	},
		{ "rgba8888_depth_no_stencil",		"RGBA8888 configs with depth and no stencil",	colorBits<8, 8, 8, 8>, hasDepth,	noStencil	},
		{ "rgba8888_depth_stencil",			"RGBA8888 configs with depth and stencil",		colorBits<8, 8, 8, 8>, hasDepth,	hasStencil	}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(groups); groupNdx++)
	{
		eglu::FilterList filter;

		filter << groups[groupNdx].colorFilter
			   << groups[groupNdx].depthFilter
			   << groups[groupNdx].stencilFilter
			   << getRenderableFilter(m_apiBit);

		addChild(new CreateContextExtCase(m_eglTestCtx, m_api, &(m_attribList[0]), filter, groups[groupNdx].name, groups[groupNdx].description));
	}
	// \todo [mika] Add other group
}